

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O2

void __thiscall CServerBrowser::CServerBrowser(CServerBrowser *this)

{
  EVP_PKEY_CTX *in_RSI;
  CServerlist *this_00;
  long lVar1;
  bool bVar2;
  
  (this->super_IServerBrowser).super_IInterface.m_pKernel = (IKernel *)0x0;
  (this->super_IServerBrowser).super_IInterface._vptr_IInterface =
       (_func_int **)&PTR__CServerBrowser_00206620;
  CServerBrowserFavorites::CServerBrowserFavorites(&this->m_ServerBrowserFavorites);
  array<CServerBrowserFilter::CServerFilter,_allocator_default<CServerBrowserFilter::CServerFilter>_>
  ::init(&(this->m_ServerBrowserFilter).m_lFilters,in_RSI);
  this_00 = this->m_aServerlist;
  CHeap::CHeap(&this_00->m_ServerlistHeap);
  CHeap::CHeap(&this->m_aServerlist[1].m_ServerlistHeap);
  this->m_pMasterServer = (IMasterServer *)0x0;
  lVar1 = 2;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    CServerlist::Clear(this_00);
    this_00->m_NumServerCapacity = 0;
    this_00->m_ppServerlist = (CServerEntry **)0x0;
    this_00 = this_00 + 1;
  }
  this->m_pFirstReqServer = (CServerEntry *)0x0;
  this->m_pLastReqServer = (CServerEntry *)0x0;
  *(undefined8 *)((long)&this->m_pLastReqServer + 1) = 0;
  *(undefined8 *)((long)&this->m_NumRequests + 1) = 0;
  this->m_CurrentLanToken = 1;
  this->m_RefreshFlags = 0;
  this->m_ActServerlistType = 0;
  this->m_BroadcastTime = 0;
  this->m_MasterRefreshTime = 0;
  return;
}

Assistant:

CServerBrowser::CServerBrowser()
{
	m_pMasterServer = 0;

	//
	for(int i = 0; i < NUM_TYPES; ++i)
	{
		m_aServerlist[i].Clear();
		m_aServerlist[i].m_NumServerCapacity = 0;
		m_aServerlist[i].m_ppServerlist = 0;
	}

	m_pFirstReqServer = 0; // request list
	m_pLastReqServer = 0;
	m_NumRequests = 0;

	m_NeedRefresh = 0;
	m_RefreshFlags = 0;
	m_InfoUpdated = false;

	// the token is to keep server refresh separated from each other
	m_CurrentLanToken = 1;

	m_ActServerlistType = 0;
	m_BroadcastTime = 0;
	m_MasterRefreshTime = 0;
}